

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O2

void filetree_remove_common_prefix(GSList *files)

{
  char *__s;
  string_plus_length spl;
  string_plus_length common_prefix;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  char *local_28;
  size_t local_20;
  
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  if (files != (GSList *)0x0) {
    g_slist_foreach(files,get_shortest_string,&local_38);
    __s = (char *)g_path_get_dirname(CONCAT44(uStack_34,local_38));
    local_28 = __s;
    local_20 = strlen(__s);
    g_slist_foreach(files,find_common_prefix,&local_28);
    g_slist_foreach(files,remove_prefix,&local_20);
    g_free(__s);
  }
  return;
}

Assistant:

void filetree_remove_common_prefix(GSList *files) {
    struct string_plus_length spl = { NULL, (size_t) -1 }, common_prefix;
    char *shortest_dir_name;

    if (!files) return;
    g_slist_foreach(files, get_shortest_string, &spl);
    common_prefix.string = shortest_dir_name = g_path_get_dirname(spl.string);
    common_prefix.length = strlen(common_prefix.string);
    g_slist_foreach(files, (GFunc) find_common_prefix, &common_prefix);
    g_slist_foreach(files, (GFunc) remove_prefix, &common_prefix.length);

    g_free(shortest_dir_name);
}